

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

void __thiscall
ctemplate::JsonEscape::Modify
          (JsonEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  char *limit;
  char *start;
  char *pos;
  string *arg_local;
  ExpandEmitter *out_local;
  PerExpandData *param_3_local;
  size_t inlen_local;
  char *in_local;
  JsonEscape *this_local;
  
  limit = in;
  start = in;
LAB_00177f6c:
  do {
    if (in + inlen <= start) {
      EmitRun(limit,start,out);
      return;
    }
    switch(*start) {
    case '\b':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\b",2);
      break;
    case '\t':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\t",2);
      break;
    case '\n':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\n",2);
      break;
    default:
      goto switchD_00177fa1_caseD_b;
    case '\f':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\f",2);
      break;
    case '\r':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\r",2);
      break;
    case '\"':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\\"",2);
      break;
    case '&':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\u0026",6);
      break;
    case '/':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\/",2);
      break;
    case '<':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\u003C",6);
      break;
    case '>':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\u003E",6);
      break;
    case '\\':
      EmitRun(limit,start,out);
      (*out->_vptr_ExpandEmitter[5])(out,"\\\\",2);
    }
    limit = start + 1;
    start = limit;
  } while( true );
switchD_00177fa1_caseD_b:
  start = start + 1;
  goto LAB_00177f6c;
}

Assistant:

void JsonEscape::Modify(const char* in, size_t inlen,
                        const PerExpandData*,
                        ExpandEmitter* out, const string& arg) const {
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit) {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      case '"':  EmitRun(start, pos, out); APPEND("\\\"");    break;
      case '\\': EmitRun(start, pos, out); APPEND("\\\\");    break;
      case '/':  EmitRun(start, pos, out); APPEND("\\/");     break;
      case '\b': EmitRun(start, pos, out); APPEND("\\b");     break;
      case '\f': EmitRun(start, pos, out); APPEND("\\f");     break;
      case '\n': EmitRun(start, pos, out); APPEND("\\n");     break;
      case '\r': EmitRun(start, pos, out); APPEND("\\r");     break;
      case '\t': EmitRun(start, pos, out); APPEND("\\t");     break;
      case '&':  EmitRun(start, pos, out); APPEND("\\u0026"); break;
      case '<':  EmitRun(start, pos, out); APPEND("\\u003C"); break;
      case '>':  EmitRun(start, pos, out); APPEND("\\u003E"); break;
    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
}